

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O1

mz_bool mz_zip_reader_extract_to_callback
                  (mz_zip_archive *pZip,mz_uint file_index,mz_file_write_func pCallback,
                  void *pOpaque,mz_uint flags)

{
  mz_zip_internal_state *pmVar1;
  void *pvVar2;
  bool bVar3;
  mz_bool mVar4;
  tinfl_status tVar5;
  size_t sVar6;
  mz_ulong mVar7;
  mz_zip_error mVar8;
  mz_uint8 *pmVar9;
  ulong uVar10;
  uint uVar11;
  mz_uint64 mVar12;
  ulong uVar13;
  mz_uint8 *pmVar14;
  size_t out_buf_size;
  size_t in_buf_size;
  mz_uint32 local_header_u32 [8];
  mz_zip_archive_file_stat file_stat;
  tinfl_decompressor inflator;
  ulong local_3000;
  mz_uint64 local_2ff8;
  long local_2fe8;
  ulong local_2fe0;
  mz_uint64 local_2fd0;
  size_t local_2fc8;
  mz_uint8 *local_2fc0;
  size_t local_2fb8;
  ulong local_2fb0;
  int local_2fa8 [6];
  ushort local_2f8e;
  ushort local_2f8c;
  mz_zip_archive_file_stat local_2f80;
  tinfl_decompressor local_2b28;
  
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pmVar1 = pZip->m_pState;
  if ((pCallback == (mz_file_write_func)0x0 || pmVar1 == (mz_zip_internal_state *)0x0) ||
     (pZip->m_pRead == (mz_file_read_func)0x0)) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
      return 0;
    }
    return 0;
  }
  if (file_index < pZip->m_total_files) {
    if (((pmVar1->m_central_dir_offsets).m_size <= (ulong)file_index) ||
       (uVar10 = (ulong)*(uint *)((long)(pmVar1->m_central_dir_offsets).m_p + (ulong)file_index * 4)
       , (pmVar1->m_central_dir).m_size <= uVar10)) {
      __assert_fail("index < pArray->m_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/test/../Zippy/library/Zippy/miniz/miniz.h"
                    ,0x129b,"mz_uint mz_zip_array_range_check(const mz_zip_array *, mz_uint)");
    }
    pmVar9 = (mz_uint8 *)(uVar10 + (long)(pmVar1->m_central_dir).m_p);
  }
  else {
    pmVar9 = (mz_uint8 *)0x0;
  }
  mVar4 = mz_zip_file_stat_internal(pZip,file_index,pmVar9,&local_2f80,(mz_bool *)0x0);
  if (mVar4 == 0) {
    return 0;
  }
  if (local_2f80.m_is_directory != 0) {
    return 1;
  }
  if (local_2f80.m_comp_size == 0) {
    return 1;
  }
  if (((byte)local_2f80.m_bit_flag & 0x61) == 0) {
    uVar11 = flags & 0x400;
    if ((uVar11 == 0) && ((local_2f80.m_method & 0xfff7) != 0)) {
      pZip->m_last_error = MZ_ZIP_UNSUPPORTED_METHOD;
    }
    else {
      sVar6 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_2f80.m_local_header_ofs,local_2fa8,0x1e);
      if (sVar6 == 0x1e) {
        if (local_2fa8[0] == 0x4034b50) {
          local_2fe0 = local_2f80.m_comp_size;
          if (local_2f80.m_comp_size + 0x1e +
              local_2f80.m_local_header_ofs + local_2f8e + (ulong)local_2f8c <= pZip->m_archive_size
             ) {
            local_2fd0 = (ulong)local_2f8c + 0x1e + local_2f80.m_local_header_ofs + local_2f8e;
            pvVar2 = pZip->m_pState->m_pMem;
            if (pvVar2 == (void *)0x0) {
              if (0xffff < local_2f80.m_comp_size) {
                local_2fe0 = 0x10000;
              }
              pmVar9 = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,local_2fe0);
              if (pmVar9 == (mz_uint8 *)0x0) {
                pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
                return 0;
              }
              mVar12 = 0;
              uVar10 = local_2f80.m_comp_size;
            }
            else {
              pmVar9 = (mz_uint8 *)((long)pvVar2 + local_2fd0);
              mVar12 = local_2f80.m_comp_size;
              uVar10 = 0;
            }
            if ((uVar11 == 0) && (local_2f80.m_method != 0)) {
              local_2b28.m_state = 0;
              local_2fc0 = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x8000);
              if (local_2fc0 == (mz_uint8 *)0x0) {
                pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
                tVar5 = TINFL_STATUS_FAILED;
                local_3000._0_4_ = 0;
                local_2ff8 = 0;
                pmVar14 = local_2fc0;
              }
              else {
                local_3000 = 0;
                local_2fe8 = 0;
                local_2ff8 = 0;
                do {
                  uVar13 = (ulong)((uint)local_2ff8 & 0x7fff);
                  local_2fc8 = 0x8000 - uVar13;
                  if (mVar12 == 0) {
                    if (pZip->m_pState->m_pMem != (void *)0x0) {
                      mVar12 = 0;
                      goto LAB_00118942;
                    }
                    mVar12 = uVar10;
                    if (local_2fe0 < uVar10) {
                      mVar12 = local_2fe0;
                    }
                    sVar6 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_2fd0,pmVar9,mVar12);
                    if (sVar6 == mVar12) {
                      local_2fd0 = local_2fd0 + mVar12;
                      uVar10 = uVar10 - mVar12;
                      local_2fe8 = 0;
                      goto LAB_00118942;
                    }
                    pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
LAB_00118a28:
                    bVar3 = false;
                    tVar5 = TINFL_STATUS_FAILED;
                  }
                  else {
LAB_00118942:
                    pmVar14 = local_2fc0 + uVar13;
                    local_2fb8 = mVar12;
                    tVar5 = tinfl_decompress(&local_2b28,pmVar9 + local_2fe8,&local_2fb8,local_2fc0,
                                             pmVar14,&local_2fc8,(uint)(uVar10 != 0) * 2);
                    mVar12 = mVar12 - local_2fb8;
                    local_2fe8 = local_2fb8 + local_2fe8;
                    bVar3 = true;
                    if (local_2fc8 != 0) {
                      local_2fb0 = (ulong)(uint)tVar5;
                      sVar6 = (*pCallback)(pOpaque,local_2ff8,pmVar14,local_2fc8);
                      if (sVar6 == local_2fc8) {
                        local_3000 = mz_crc32(local_3000 & 0xffffffff,pmVar14,local_2fc8);
                        local_2ff8 = local_2ff8 + local_2fc8;
                        if (local_2ff8 <= local_2f80.m_uncomp_size) {
                          tVar5 = (tinfl_status)local_2fb0;
                          bVar3 = true;
                          goto LAB_00118a4b;
                        }
                        pZip->m_last_error = MZ_ZIP_DECOMPRESSION_FAILED;
                      }
                      else {
                        pZip->m_last_error = MZ_ZIP_WRITE_CALLBACK_FAILED;
                      }
                      goto LAB_00118a28;
                    }
                  }
LAB_00118a4b:
                  pmVar14 = local_2fc0;
                } while ((bVar3) && ((uint)(tVar5 + TINFL_STATUS_FAILED) < 2));
              }
            }
            else if (pZip->m_pState->m_pMem == (void *)0x0) {
              if (uVar10 == 0) {
                local_3000._0_4_ = 0;
                local_2ff8 = 0;
              }
              else {
                local_2ff8 = 0;
                local_3000 = 0;
                do {
                  uVar13 = uVar10;
                  if (local_2fe0 < uVar10) {
                    uVar13 = local_2fe0;
                  }
                  sVar6 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_2fd0,pmVar9,uVar13);
                  if (sVar6 != uVar13) {
                    pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
LAB_00118c17:
                    tVar5 = TINFL_STATUS_FAILED;
                    goto LAB_00118c1c;
                  }
                  if (uVar11 == 0) {
                    local_3000 = mz_crc32(local_3000 & 0xffffffff,pmVar9,uVar13);
                  }
                  sVar6 = (*pCallback)(pOpaque,local_2ff8,pmVar9,uVar13);
                  if (sVar6 != uVar13) {
                    pZip->m_last_error = MZ_ZIP_WRITE_CALLBACK_FAILED;
                    goto LAB_00118c17;
                  }
                  local_2fd0 = local_2fd0 + uVar13;
                  local_2ff8 = local_2ff8 + uVar13;
                  uVar10 = uVar10 - uVar13;
                } while (uVar10 != 0);
              }
              tVar5 = TINFL_STATUS_DONE;
              pmVar14 = (mz_uint8 *)0x0;
            }
            else {
              local_3000._0_4_ = 0;
              sVar6 = (*pCallback)(pOpaque,0,pmVar9,local_2f80.m_comp_size);
              if (sVar6 == local_2f80.m_comp_size) {
                local_3000._0_4_ = 0;
                tVar5 = TINFL_STATUS_DONE;
                if (uVar11 == 0) {
                  mVar7 = mz_crc32(0,pmVar9,local_2f80.m_comp_size);
                  local_3000._0_4_ = (mz_uint32)mVar7;
                  tVar5 = TINFL_STATUS_DONE;
                }
              }
              else {
                pZip->m_last_error = MZ_ZIP_WRITE_CALLBACK_FAILED;
                tVar5 = TINFL_STATUS_FAILED;
              }
              local_2ff8 = local_2f80.m_comp_size;
LAB_00118c1c:
              pmVar14 = (mz_uint8 *)0x0;
            }
            if (uVar11 == 0 && tVar5 == TINFL_STATUS_DONE) {
              mVar8 = MZ_ZIP_UNEXPECTED_DECOMPRESSED_SIZE;
              if (local_2ff8 == local_2f80.m_uncomp_size) {
                mVar8 = MZ_ZIP_DECOMPRESSION_FAILED;
                uVar11 = 1;
                if ((mz_uint32)local_3000 == local_2f80.m_crc32) goto LAB_00118c68;
              }
              pZip->m_last_error = mVar8;
              uVar11 = 0;
            }
            else {
              uVar11 = (uint)(tVar5 == TINFL_STATUS_DONE);
            }
LAB_00118c68:
            if (pZip->m_pState->m_pMem == (void *)0x0) {
              (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pmVar9);
            }
            if (pmVar14 != (mz_uint8 *)0x0) {
              (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pmVar14);
              return uVar11;
            }
            return uVar11;
          }
        }
        pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
      }
      else {
        pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
      }
    }
  }
  else {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
  }
  return 0;
}

Assistant:

inline mz_bool mz_zip_reader_extract_to_callback(mz_zip_archive* pZip,
                                                 mz_uint file_index,
                                                 mz_file_write_func pCallback,
                                                 void* pOpaque,
                                                 mz_uint flags) {

    int status = TINFL_STATUS_DONE;
    mz_uint file_crc32 = MZ_CRC32_INIT;
    mz_uint64 read_buf_size, read_buf_ofs = 0, read_buf_avail, comp_remaining, out_buf_ofs = 0, cur_file_ofs;
    mz_zip_archive_file_stat file_stat;
    void* pRead_buf = NULL;
    void* pWrite_buf = NULL;
    mz_uint32 local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8* pLocal_header = (mz_uint8*)local_header_u32;

    if ((!pZip) || (!pZip->m_pState) || (!pCallback) || (!pZip->m_pRead))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (!mz_zip_reader_file_stat(pZip, file_index, &file_stat))
        return MZ_FALSE;

    /* A directory or zero length file */
    if ((file_stat.m_is_directory) || (!file_stat.m_comp_size))
        return MZ_TRUE;

    /* Encryption and patch files are not supported. */
    if (file_stat.m_bit_flag
            & (MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_IS_ENCRYPTED | MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_USES_STRONG_ENCRYPTION
                    | MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_COMPRESSED_PATCH_FLAG))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);

    /* This function only supports decompressing stored and deflate. */
    if ((!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (file_stat.m_method != 0) && (file_stat.m_method != MZ_DEFLATED))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_METHOD);

    /* Read and do some minimal validation of the local directory entry (this doesn't crack the zip64 stuff, which we already have from the central dir) */
    cur_file_ofs = file_stat.m_local_header_ofs;
    if (pZip->m_pRead(pZip->m_pIO_opaque,
                      cur_file_ofs,
                      pLocal_header,
                      MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    cur_file_ofs +=
            MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS) + MZ_READ_LE16(
                    pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
    if ((cur_file_ofs + file_stat.m_comp_size) > pZip->m_archive_size)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    /* Decompress the file either directly from memory or from a file input buffer. */
    if (pZip->m_pState->m_pMem) {
        pRead_buf = (mz_uint8*)pZip->m_pState->m_pMem + cur_file_ofs;
        read_buf_size = read_buf_avail = file_stat.m_comp_size;
        comp_remaining = 0;
    }
    else {
        read_buf_size = MZ_MIN(file_stat.m_comp_size, (mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE);
        if (NULL == (pRead_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, (size_t)read_buf_size)))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

        read_buf_avail = 0;
        comp_remaining = file_stat.m_comp_size;
    }

    if ((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) || (!file_stat.m_method)) {
        /* The file is stored or the caller has requested the compressed data. */
        if (pZip->m_pState->m_pMem) {
            if (((sizeof(size_t) == sizeof(mz_uint32))) && (file_stat.m_comp_size > MZ_UINT32_MAX))
                return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

            if (pCallback(pOpaque, out_buf_ofs, pRead_buf, (size_t)file_stat.m_comp_size) != file_stat.m_comp_size) {
                mz_zip_set_error(pZip, MZ_ZIP_WRITE_CALLBACK_FAILED);
                status = TINFL_STATUS_FAILED;
            }
            else if (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) {
#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
                file_crc32 = (mz_uint32)mz_crc32(file_crc32, (const mz_uint8*)pRead_buf, (size_t)file_stat.m_comp_size);
#endif
            }

            cur_file_ofs += file_stat.m_comp_size;
            out_buf_ofs += file_stat.m_comp_size;
            comp_remaining = 0;
        }
        else {
            while (comp_remaining) {
                read_buf_avail = MZ_MIN(read_buf_size, comp_remaining);
                if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pRead_buf, (size_t)read_buf_avail)
                        != read_buf_avail) {
                    mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
                    status = TINFL_STATUS_FAILED;
                    break;
                }

#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
                if (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) {
                    file_crc32 = (mz_uint32)mz_crc32(file_crc32, (const mz_uint8*)pRead_buf, (size_t)read_buf_avail);
                }
#endif

                if (pCallback(pOpaque, out_buf_ofs, pRead_buf, (size_t)read_buf_avail) != read_buf_avail) {
                    mz_zip_set_error(pZip, MZ_ZIP_WRITE_CALLBACK_FAILED);
                    status = TINFL_STATUS_FAILED;
                    break;
                }

                cur_file_ofs += read_buf_avail;
                out_buf_ofs += read_buf_avail;
                comp_remaining -= read_buf_avail;
            }
        }
    }
    else {
        tinfl_decompressor inflator;
        tinfl_init(&inflator);

        if (NULL == (pWrite_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, TINFL_LZ_DICT_SIZE))) {
            mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
            status = TINFL_STATUS_FAILED;
        }
        else {
            do {
                mz_uint8* pWrite_buf_cur = (mz_uint8*)pWrite_buf + (out_buf_ofs & (TINFL_LZ_DICT_SIZE - 1));
                size_t in_buf_size, out_buf_size = TINFL_LZ_DICT_SIZE - (out_buf_ofs & (TINFL_LZ_DICT_SIZE - 1));
                if ((!read_buf_avail) && (!pZip->m_pState->m_pMem)) {
                    read_buf_avail = MZ_MIN(read_buf_size, comp_remaining);
                    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pRead_buf, (size_t)read_buf_avail)
                            != read_buf_avail) {
                        mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
                        status = TINFL_STATUS_FAILED;
                        break;
                    }
                    cur_file_ofs += read_buf_avail;
                    comp_remaining -= read_buf_avail;
                    read_buf_ofs = 0;
                }

                in_buf_size = (size_t)read_buf_avail;
                status = tinfl_decompress(&inflator,
                                          (const mz_uint8*)pRead_buf + read_buf_ofs,
                                          &in_buf_size,
                                          (mz_uint8*)pWrite_buf,
                                          pWrite_buf_cur,
                                          &out_buf_size,
                                          comp_remaining ? TINFL_FLAG_HAS_MORE_INPUT : 0);
                read_buf_avail -= in_buf_size;
                read_buf_ofs += in_buf_size;

                if (out_buf_size) {
                    if (pCallback(pOpaque, out_buf_ofs, pWrite_buf_cur, out_buf_size) != out_buf_size) {
                        mz_zip_set_error(pZip, MZ_ZIP_WRITE_CALLBACK_FAILED);
                        status = TINFL_STATUS_FAILED;
                        break;
                    }

#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
                    file_crc32 = (mz_uint32)mz_crc32(file_crc32, pWrite_buf_cur, out_buf_size);
#endif
                    if ((out_buf_ofs += out_buf_size) > file_stat.m_uncomp_size) {
                        mz_zip_set_error(pZip, MZ_ZIP_DECOMPRESSION_FAILED);
                        status = TINFL_STATUS_FAILED;
                        break;
                    }
                }
            } while ((status == TINFL_STATUS_NEEDS_MORE_INPUT) || (status == TINFL_STATUS_HAS_MORE_OUTPUT));
        }
    }

    if ((status == TINFL_STATUS_DONE) && (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA))) {
        /* Make sure the entire file was decompressed, and check its CRC. */
        if (out_buf_ofs != file_stat.m_uncomp_size) {
            mz_zip_set_error(pZip, MZ_ZIP_UNEXPECTED_DECOMPRESSED_SIZE);
            status = TINFL_STATUS_FAILED;
        }
#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
        else if (file_crc32 != file_stat.m_crc32) {
            mz_zip_set_error(pZip, MZ_ZIP_DECOMPRESSION_FAILED);
            status = TINFL_STATUS_FAILED;
        }
#endif
    }

    if (!pZip->m_pState->m_pMem)
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);

    if (pWrite_buf)
        pZip->m_pFree(pZip->m_pAlloc_opaque, pWrite_buf);

    return status == TINFL_STATUS_DONE;
}